

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# codegen.c
# Opt level: O3

void emit_varname_or_constant(Function *fn,Pseudo *pseudo)

{
  ravitype_t rVar1;
  Constant *pCVar2;
  uint uVar3;
  char *pcVar4;
  
  uVar3 = *(uint *)pseudo & 0xf;
  if (uVar3 - 1 < 3) {
    emit_varname(fn,pseudo);
    return;
  }
  if (uVar3 == 0) {
    if (((pseudo->field_3).symbol)->symbol_type < SYM_GLOBAL) {
      rVar1 = (((pseudo->field_3).symbol)->field_1).variable.value_type.type_code;
      if (rVar1 == RAVI_TNUMINT) {
        pcVar4 = "ivalue(";
LAB_0012248f:
        raviX_buffer_add_string(&fn->body,pcVar4);
        emit_reg_accessor(fn,pseudo,0);
        raviX_buffer_add_string(&fn->body,")");
        return;
      }
      if (rVar1 == RAVI_TNUMFLT) {
        pcVar4 = "fltvalue(";
        goto LAB_0012248f;
      }
    }
  }
  else if (uVar3 == 5) {
    pCVar2 = (pseudo->field_3).constant;
    if (pCVar2->type == 0x10) {
      raviX_buffer_add_double(&fn->body,(pCVar2->field_2).n);
      return;
    }
    if (pCVar2->type == 8) {
      raviX_buffer_add_fstring(&fn->body,"%lld",(pCVar2->field_2).i);
      return;
    }
    pcVar4 = "emit_varname_or_constant: Unexpected pseudo type";
    goto LAB_001224bf;
  }
  pcVar4 = "emit_varname_or_constant: Unexpected pseudo";
LAB_001224bf:
  handle_error_bad_pseudo(fn,pseudo,pcVar4);
}

Assistant:

static void emit_varname_or_constant(Function *fn, Pseudo *pseudo)
{
	if (pseudo->type == PSEUDO_CONSTANT) {
		if (pseudo->constant->type == RAVI_TNUMINT) {
			raviX_buffer_add_fstring(&fn->body, "%lld", pseudo->constant->i);
		} else if (pseudo->constant->type == RAVI_TNUMFLT) {
			raviX_buffer_add_double(&fn->body, pseudo->constant->n);
		} else {
			handle_error_bad_pseudo(fn, pseudo, "emit_varname_or_constant: Unexpected pseudo type");
		}
	} else if (pseudo->type == PSEUDO_TEMP_INT || pseudo->type == PSEUDO_TEMP_BOOL ||
		   pseudo->type == PSEUDO_TEMP_FLT) {
		emit_varname(fn, pseudo);
	} else if (pseudo->type == PSEUDO_SYMBOL) {
		ravitype_t typecode = RAVI_TANY;
		if (pseudo->symbol->symbol_type == SYM_LOCAL) {
			typecode = pseudo->symbol->variable.value_type.type_code;
		} else if (pseudo->symbol->symbol_type == SYM_UPVALUE) {
			typecode = pseudo->symbol->upvalue.value_type.type_code;
		}
		if (typecode == RAVI_TNUMFLT) {
			raviX_buffer_add_string(&fn->body, "fltvalue(");
			emit_reg_accessor(fn, pseudo, 0); // discriminator not used
			raviX_buffer_add_string(&fn->body, ")");
		} else if (typecode == RAVI_TNUMINT) {
			raviX_buffer_add_string(&fn->body, "ivalue(");
			emit_reg_accessor(fn, pseudo, 0); // discriminator not used
			raviX_buffer_add_string(&fn->body, ")");
		} else {
			handle_error_bad_pseudo(fn, pseudo, "emit_varname_or_constant: Unexpected pseudo");
		}
	} else {
		handle_error_bad_pseudo(fn, pseudo, "emit_varname_or_constant: Unexpected pseudo");
	}
}